

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::Buffer::Buffer
          (Buffer *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkBufferCreateInfo *bufferCreateInfo,MemoryRequirement memoryRequirement)

{
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  VkBufferCreateInfo *allocator_00;
  Allocator *device_00;
  Handle<(vk::HandleType)8> *pHVar1;
  VkDevice this_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_98;
  Move<vk::Handle<(vk::HandleType)8>_> local_78;
  RefData<vk::Handle<(vk::HandleType)8>_> local_58;
  VkBufferCreateInfo *local_38;
  VkBufferCreateInfo *bufferCreateInfo_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  Buffer *this_local;
  MemoryRequirement memoryRequirement_local;
  
  local_38 = bufferCreateInfo;
  bufferCreateInfo_local = (VkBufferCreateInfo *)allocator;
  allocator_local = (Allocator *)device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)this;
  this_local._4_4_ = memoryRequirement.m_flags;
  ::vk::createBuffer(&local_78,vk,device,bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data_00.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data_00.object.m_internal = local_58.object.m_internal;
  data_00.deleter.m_device = local_58.deleter.m_device;
  data_00.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_buffer,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_78);
  this_00 = device_local;
  device_00 = allocator_local;
  allocator_00 = bufferCreateInfo_local;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a8,
             (DeviceInterface *)this_00,(VkDevice)device_00,(Allocator *)allocator_00,
             (VkBuffer)pHVar1->m_internal,this_local._4_4_);
  local_98 = de::details::MovePtr::operator_cast_to_PtrData(&local_a8,(MovePtr *)this_00);
  data._8_8_ = local_58.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_58.object.m_internal;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_allocation,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a8);
  return;
}

Assistant:

Buffer::Buffer (const vk::DeviceInterface&		vk,
				const vk::VkDevice				device,
				vk::Allocator&					allocator,
				const vk::VkBufferCreateInfo&	bufferCreateInfo,
				const vk::MemoryRequirement		memoryRequirement)
	: m_buffer		(createBuffer(vk, device, &bufferCreateInfo))
	, m_allocation	(bindBuffer(vk, device, allocator, *m_buffer, memoryRequirement))
{
}